

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O2

void __thiscall Imf_3_2::anon_unknown_6::TileBufferTask::execute(TileBufferTask *this)

{
  pointer pTVar1;
  TileBuffer *pTVar2;
  Data *pDVar3;
  pointer pTVar4;
  size_t xStride;
  uint *puVar5;
  long *plVar6;
  int iVar7;
  long lVar8;
  int y;
  int iVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  size_t numPixels;
  Box2i tileRange;
  char *writePtr;
  char *readPtr;
  char *compPtr;
  char *local_48 [2];
  int local_38;
  int local_34;
  
  pTVar2 = this->_tileBuffer;
  writePtr = (char *)(pTVar2->sampleCount)._sizeY;
  pDVar3 = this->_ofd;
  Imf_3_2::dataWindowForTile
            ((Imf_3_2 *)&tileRange,&pDVar3->tileDesc,pDVar3->minX,pDVar3->maxX,pDVar3->minY,
             pDVar3->maxY,(int)pTVar2->dataSize,*(int *)((long)&pTVar2->dataSize + 4),
             (int)pTVar2->uncompressedDataSize,*(int *)((long)&pTVar2->uncompressedDataSize + 4));
  iVar7 = tileRange.max.y - tileRange.min.y;
  lVar10 = (long)tileRange.max.x;
  lVar8 = (long)tileRange.min.x;
  numPixels = (size_t)((int)(lVar10 - lVar8) + 1);
  for (iVar9 = tileRange.min.y; iVar9 <= tileRange.max.y; iVar9 = iVar9 + 1) {
    uVar11 = 0;
    while( true ) {
      uVar12 = (ulong)uVar11;
      pDVar3 = this->_ofd;
      pTVar4 = (pDVar3->slices).
               super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(pDVar3->slices).
                         super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4) / 0x30) <=
          uVar12) break;
      pTVar1 = pTVar4 + uVar12;
      if (pTVar4[uVar12].zero == true) {
        fillChannelWithZeroes(&writePtr,pDVar3->format,pTVar1->type,numPixels);
      }
      else {
        xStride = pTVar1->xStride;
        readPtr = pTVar1->base +
                  (long)(iVar9 - tileRange.min.y * pTVar1->yTileCoords) * pTVar1->yStride +
                  (long)((1 - pTVar1->xTileCoords) * tileRange.min.x) * xStride;
        copyFromFrameBuffer(&writePtr,&readPtr,readPtr + xStride * (lVar10 - lVar8),xStride,
                            pDVar3->format,pTVar1->type);
      }
      uVar11 = uVar11 + 1;
    }
  }
  pTVar2 = this->_tileBuffer;
  puVar5 = (uint *)(pTVar2->sampleCount)._sizeY;
  plVar6 = (long *)pTVar2->buffer;
  *(int *)&pTVar2->uncompressedData = (int)writePtr - (int)puVar5;
  (pTVar2->sampleCount)._data = puVar5;
  if (plVar6 != (long *)0x0) {
    local_38 = tileRange.max.x;
    local_34 = tileRange.max.y;
    iVar9 = (**(code **)(*plVar6 + 0x28))();
    pTVar2 = this->_tileBuffer;
    if (iVar9 < *(int *)&pTVar2->uncompressedData) {
      *(int *)&pTVar2->uncompressedData = iVar9;
      (pTVar2->sampleCount)._data = (uint *)compPtr;
    }
    else {
      pDVar3 = this->_ofd;
      if (pDVar3->format == NATIVE) {
        readPtr = (char *)(pTVar2->sampleCount)._sizeY;
        iVar9 = -1;
        if (-1 < iVar7) {
          iVar9 = iVar7;
        }
        local_48[0] = readPtr;
        for (iVar7 = 0; iVar7 != iVar9 + 1; iVar7 = iVar7 + 1) {
          uVar11 = 0;
          while( true ) {
            pTVar4 = (pDVar3->slices).
                     super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(((long)(pDVar3->slices).
                               super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4) / 0x30) <=
                (ulong)uVar11) break;
            convertInPlace(&readPtr,local_48,pTVar4[uVar11].type,numPixels);
            uVar11 = uVar11 + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
TileBufferTask::execute ()
{
    try
    {
        //
        // Calculate information about the tile
        //

        Box2i tileRange = OPENEXR_IMF_INTERNAL_NAMESPACE::dataWindowForTile (
            _ifd->tileDesc,
            _ifd->minX,
            _ifd->maxX,
            _ifd->minY,
            _ifd->maxY,
            _tileBuffer->dx,
            _tileBuffer->dy,
            _tileBuffer->lx,
            _tileBuffer->ly);

        //
        // Get the size of the tile.
        //

        Array<unsigned int> numPixelsPerScanLine;
        numPixelsPerScanLine.resizeErase (
            tileRange.max.y - tileRange.min.y + 1);

        int sizeOfTile          = 0;
        int maxBytesPerTileLine = 0;

        for (int y = tileRange.min.y; y <= tileRange.max.y; y++)
        {
            numPixelsPerScanLine[y - tileRange.min.y] = 0;

            int bytesPerLine = 0;

            for (int x = tileRange.min.x; x <= tileRange.max.x; x++)
            {
                int xOffset = _ifd->sampleCountXTileCoords * tileRange.min.x;
                int yOffset = _ifd->sampleCountYTileCoords * tileRange.min.y;

                int count = _ifd->getSampleCount (x - xOffset, y - yOffset);
                for (unsigned int c = 0; c < _ifd->slices.size (); ++c)
                {
                    // This slice does not exist in the file.
                    if (!_ifd->slices[c]->fill)
                    {
                        sizeOfTile +=
                            count * pixelTypeSize (_ifd->slices[c]->typeInFile);
                        bytesPerLine +=
                            count * pixelTypeSize (_ifd->slices[c]->typeInFile);
                    }
                }
                numPixelsPerScanLine[y - tileRange.min.y] += count;
            }

            if (bytesPerLine > maxBytesPerTileLine)
                maxBytesPerTileLine = bytesPerLine;
        }

        // (TODO) don't do this every time.
        if (_tileBuffer->compressor != 0) delete _tileBuffer->compressor;
        _tileBuffer->compressor = newTileCompressor (
            _ifd->header.compression (),
            maxBytesPerTileLine,
            _ifd->tileDesc.ySize,
            _ifd->header);

        //
        // Uncompress the data, if necessary
        //

        if (_tileBuffer->compressor &&
            _tileBuffer->dataSize < static_cast<uint64_t> (sizeOfTile))
        {
            _tileBuffer->format = _tileBuffer->compressor->format ();

            _tileBuffer->dataSize = _tileBuffer->compressor->uncompressTile (
                _tileBuffer->buffer,
                static_cast<int> (_tileBuffer->dataSize),
                tileRange,
                _tileBuffer->uncompressedData);
        }
        else
        {
            //
            // If the line is uncompressed, it's in XDR format,
            // regardless of the compressor's output format.
            //

            _tileBuffer->format           = Compressor::XDR;
            _tileBuffer->uncompressedData = _tileBuffer->buffer;
        }

        //
        // sanity check data size: the uncompressed data should be exactly
        // 'sizeOfTile' (if it's less, the file is corrupt and there'll be a buffer overrun)
        //
        if (_tileBuffer->dataSize != static_cast<uint64_t> (sizeOfTile))
        {
            THROW (
                IEX_NAMESPACE::InputExc,
                "size mismatch when reading deep tile: expected "
                    << sizeOfTile << "bytes of uncompressed data but got "
                    << _tileBuffer->dataSize);
        }

        //
        // Convert the tile of pixel data back from the machine-independent
        // representation, and store the result in the frame buffer.
        //

        const char* readPtr = _tileBuffer->uncompressedData;
        // points to where we
        // read from in the
        // tile block

        //
        // Iterate over the scan lines in the tile.
        //

        for (int y = tileRange.min.y; y <= tileRange.max.y; ++y)
        {
            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ifd->slices.size (); ++i)
            {
                TInSliceInfo& slice = *_ifd->slices[i];

                //
                // These offsets are used to facilitate both
                // absolute and tile-relative pixel coordinates.
                //

                int xOffsetForData = (slice.xTileCoords == 0) ? 0
                                                              : tileRange.min.x;
                int yOffsetForData = (slice.yTileCoords == 0) ? 0
                                                              : tileRange.min.y;
                int xOffsetForSampleCount =
                    (_ifd->sampleCountXTileCoords == 0) ? 0 : tileRange.min.x;
                int yOffsetForSampleCount =
                    (_ifd->sampleCountYTileCoords == 0) ? 0 : tileRange.min.y;

                //
                // Fill the frame buffer with pixel data.
                //

                if (slice.skip)
                {
                    //
                    // The file contains data for this channel, but
                    // the frame buffer contains no slice for this channel.
                    //

                    skipChannel (
                        readPtr,
                        slice.typeInFile,
                        numPixelsPerScanLine[y - tileRange.min.y]);
                }
                else
                {
                    //
                    // The frame buffer contains a slice for this channel.
                    //

                    copyIntoDeepFrameBuffer (
                        readPtr,
                        slice.pointerArrayBase,
                        _ifd->sampleCountSliceBase,
                        _ifd->sampleCountXStride,
                        _ifd->sampleCountYStride,
                        y,
                        tileRange.min.x,
                        tileRange.max.x,
                        xOffsetForSampleCount,
                        yOffsetForSampleCount,
                        xOffsetForData,
                        yOffsetForData,
                        slice.sampleStride,
                        slice.xStride,
                        slice.yStride,
                        slice.fill,
                        slice.fillValue,
                        _tileBuffer->format,
                        slice.typeInFrameBuffer,
                        slice.typeInFile);
                }
            }
        }
    }
    catch (std::exception& e)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception    = e.what ();
            _tileBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception    = "unrecognized exception";
            _tileBuffer->hasException = true;
        }
    }
}